

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * jsonnet::internal::lex_number
                   (string *__return_storage_ptr__,char **c,string *filename,Location *begin)

{
  byte bVar1;
  StaticError *pSVar2;
  undefined4 uVar3;
  stringstream ss;
  string local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined1 local_1b8 [392];
  
  local_1c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1c0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = 0;
  do {
    bVar1 = **c;
    switch(uVar3) {
    case 0:
      if (9 < (byte)(bVar1 - 0x30)) {
        pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"couldn\'t lex number","");
        StaticError::StaticError(pSVar2,filename,begin,(string *)local_1b8);
        __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
      }
      uVar3 = *(undefined4 *)(&DAT_0020a9f0 + (ulong)(byte)(bVar1 - 0x30) * 4);
      break;
    case 1:
switchD_001b0a2d_caseD_1:
      if (bVar1 == 0x2e) {
        uVar3 = 3;
      }
      else {
        if ((bVar1 != 0x65) && (bVar1 != 0x45)) {
          return __return_storage_ptr__;
        }
        uVar3 = 5;
      }
      break;
    case 2:
      if (9 < bVar1 - 0x30) goto switchD_001b0a2d_caseD_1;
      uVar3 = 2;
      break;
    case 3:
      uVar3 = 4;
      if (9 < (byte)(bVar1 - 0x30)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"couldn\'t lex number, junk after decimal point: ",
                   0x2f);
        local_1e0._M_dataplus._M_p._0_1_ = **c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
        pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar2,filename,begin,&local_1e0);
        __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
      }
      break;
    case 4:
      if (bVar1 - 0x30 < 10) {
        uVar3 = 4;
      }
      else {
        uVar3 = 5;
        if ((bVar1 != 0x45) && (bVar1 != 0x65)) {
          return __return_storage_ptr__;
        }
      }
      break;
    case 5:
      bVar1 = bVar1 - 0x2b;
      if ((0xe < bVar1) || ((0x7fe5U >> (bVar1 & 0x1f) & 1) == 0)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"couldn\'t lex number, junk after \'E\': ",0x25);
        local_1e0._M_dataplus._M_p._0_1_ = **c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
        pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar2,filename,begin,&local_1e0);
        __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
      }
      uVar3 = *(undefined4 *)(&DAT_0020aa28 + (ulong)bVar1 * 4);
      break;
    case 6:
      uVar3 = 7;
      if (9 < (byte)(bVar1 - 0x30)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"couldn\'t lex number, junk after exponent sign: ",
                   0x2f);
        local_1e0._M_dataplus._M_p._0_1_ = **c;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),(char *)&local_1e0,1);
        pSVar2 = (StaticError *)__cxa_allocate_exception(0x60);
        std::__cxx11::stringbuf::str();
        StaticError::StaticError(pSVar2,filename,begin,&local_1e0);
        __cxa_throw(pSVar2,&StaticError::typeinfo,StaticError::~StaticError);
      }
      break;
    case 7:
      uVar3 = 7;
      if (9 < (byte)(bVar1 - 0x30)) {
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    *c = *c + 1;
  } while( true );
}

Assistant:

std::string lex_number(const char *&c, const std::string &filename, const Location &begin)
{
    // This function should be understood with reference to the linked image:
    // https://www.json.org/img/number.png

    // Note, we deviate from the json.org documentation as follows:
    // There is no reason to lex negative numbers as atomic tokens, it is better to parse them
    // as a unary operator combined with a numeric literal.  This avoids x-1 being tokenized as
    // <identifier> <number> instead of the intended <identifier> <binop> <number>.

    enum State {
        BEGIN,
        AFTER_ZERO,
        AFTER_ONE_TO_NINE,
        AFTER_DOT,
        AFTER_DIGIT,
        AFTER_E,
        AFTER_EXP_SIGN,
        AFTER_EXP_DIGIT
    } state;

    std::string r;

    state = BEGIN;
    while (true) {
        switch (state) {
            case BEGIN:
                switch (*c) {
                    case '0': state = AFTER_ZERO; break;

                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: throw StaticError(filename, begin, "couldn't lex number");
                }
                break;

            case AFTER_ZERO:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    default: goto end;
                }
                break;

            case AFTER_ONE_TO_NINE:
                switch (*c) {
                    case '.': state = AFTER_DOT; break;

                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_ONE_TO_NINE; break;

                    default: goto end;
                }
                break;

            case AFTER_DOT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after decimal point: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_DIGIT:
                switch (*c) {
                    case 'e':
                    case 'E': state = AFTER_E; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_DIGIT; break;

                    default: goto end;
                }
                break;

            case AFTER_E:
                switch (*c) {
                    case '+':
                    case '-': state = AFTER_EXP_SIGN; break;

                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after 'E': " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_SIGN:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: {
                        std::stringstream ss;
                        ss << "couldn't lex number, junk after exponent sign: " << *c;
                        throw StaticError(filename, begin, ss.str());
                    }
                }
                break;

            case AFTER_EXP_DIGIT:
                switch (*c) {
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': state = AFTER_EXP_DIGIT; break;

                    default: goto end;
                }
                break;
        }
        r += *c;
        c++;
    }
end:
    return r;
}